

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi.cpp
# Opt level: O2

void __thiscall
QRhiPassResourceTracker::registerBuffer
          (QRhiPassResourceTracker *this,QRhiBuffer *buf,int slot,BufferAccess *access,
          BufferStage *stage,UsageState *state)

{
  byte bVar1;
  BufferStage BVar2;
  Span *pSVar3;
  Entry *pEVar4;
  ulong uVar5;
  char *pcVar6;
  uint uVar7;
  BufferStage BVar8;
  long in_FS_OFFSET;
  iterator iVar9;
  Buffer local_70;
  char *local_58;
  QArrayDataPointer<char> local_50;
  QRhiBuffer *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = buf;
  iVar9 = QHash<QRhiBuffer*,QRhiPassResourceTracker::Buffer>::findImpl<QRhiBuffer*>
                    ((QHash<QRhiBuffer*,QRhiPassResourceTracker::Buffer> *)this,&local_38);
  if (iVar9.i.d == (Data<QHashPrivate::Node<QRhiBuffer_*,_QRhiPassResourceTracker::Buffer>_> *)0x0
      && iVar9.i.bucket == 0) {
    local_70.stage = *stage;
    local_70.access = *access;
    local_70.stateAtPassBegin.layout = state->layout;
    local_70.stateAtPassBegin.access = state->access;
    local_70.stateAtPassBegin.stage = state->stage;
    local_70.slot = slot;
    QHash<QRhiBuffer*,QRhiPassResourceTracker::Buffer>::
    emplace<QRhiPassResourceTracker::Buffer_const&>
              ((QHash<QRhiBuffer*,QRhiPassResourceTracker::Buffer> *)this,&local_38,&local_70);
  }
  else {
    pSVar3 = (iVar9.i.d)->spans;
    uVar5 = iVar9.i.bucket >> 7;
    uVar7 = (uint)iVar9.i.bucket & 0x7f;
    pEVar4 = pSVar3[uVar5].entries;
    bVar1 = pSVar3[uVar5].offsets[uVar7];
    if (*(BufferAccess *)(pEVar4[bVar1].storage.data + 0xc) == *access) {
      BVar2 = *(BufferStage *)(pEVar4[bVar1].storage.data + 0x10);
      BVar8 = *stage;
      if (BVar2 != BVar8) {
        if ((int)BVar2 < (int)BVar8) {
          BVar8 = BVar2;
        }
        *(BufferStage *)(pEVar4[bVar1].storage.data + 0x10) = BVar8;
        *stage = *(BufferStage *)(pEVar4[pSVar3[uVar5].offsets[uVar7]].storage.data + 0x10);
      }
    }
    else {
      local_50.d = (local_38->super_QRhiResource).m_objectName.d.d;
      local_50.ptr = (local_38->super_QRhiResource).m_objectName.d.ptr;
      local_50.size = (local_38->super_QRhiResource).m_objectName.d.size;
      if (local_50.d != (Data *)0x0) {
        LOCK();
        ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_70.slot = 2;
      local_70.stateAtPassBegin.stage = 0;
      local_70.access = BufVertexInput;
      local_70.stage = BufVertexInputStage;
      local_70.stateAtPassBegin.layout = 0;
      local_70.stateAtPassBegin.access = 0;
      local_58 = "default";
      pcVar6 = local_50.ptr;
      if (local_50.ptr == (char *)0x0) {
        pcVar6 = (char *)&QByteArray::_empty;
      }
      QMessageLogger::warning
                ((char *)&local_70,
                 "Buffer %p (%s) used with different accesses within the same pass, this is not allowed."
                 ,local_38,pcVar6);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_50);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRhiPassResourceTracker::registerBuffer(QRhiBuffer *buf, int slot, BufferAccess *access, BufferStage *stage,
                                             const UsageState &state)
{
    auto it = m_buffers.find(buf);
    if (it != m_buffers.end()) {
        if (it->access != *access) {
            const QByteArray name = buf->name();
            qWarning("Buffer %p (%s) used with different accesses within the same pass, this is not allowed.",
                     buf, name.constData());
            return;
        }
        if (it->stage != *stage) {
            it->stage = earlierStage(it->stage, *stage);
            *stage = it->stage;
        }
        return;
    }

    Buffer b;
    b.slot = slot;
    b.access = *access;
    b.stage = *stage;
    b.stateAtPassBegin = state; // first use -> initial state
    m_buffers.insert(buf, b);
}